

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

vrna_exp_param_t * vrna_exp_params_comparative(uint n_seq,vrna_md_t *md)

{
  vrna_exp_param_t *pvVar1;
  vrna_md_t md_1;
  vrna_md_t vStack_7f8;
  
  if (md != (vrna_md_t *)0x0) {
    pvVar1 = get_exp_params_ali(md,n_seq,-1.0);
    return pvVar1;
  }
  vrna_md_set_default(&vStack_7f8);
  pvVar1 = get_exp_params_ali(&vStack_7f8,n_seq,-1.0);
  return pvVar1;
}

Assistant:

PUBLIC vrna_exp_param_t *
vrna_exp_params_comparative(unsigned int  n_seq,
                            vrna_md_t     *md)
{
  if (md) {
    return get_exp_params_ali(md, n_seq, -1.);
  } else {
    vrna_md_t md;
    vrna_md_set_default(&md);
    return get_exp_params_ali(&md, n_seq, -1.);
  }
}